

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O1

void FM::OPNB::InitADPCMATable(void)

{
  int j;
  long lVar1;
  int iVar2;
  int i;
  ulong uVar3;
  int iVar4;
  undefined4 *puVar5;
  double dVar6;
  
  puVar5 = &jedi_table;
  uVar3 = 0;
  do {
    dVar6 = (double)__powidf2(0x3ff199999999999a,uVar3 & 0xffffffff);
    lVar1 = 0;
    do {
      iVar2 = (int)InitADPCMATable::table2[lVar1] * (int)(dVar6 * 16.0 * 3.0);
      iVar4 = iVar2 + 7;
      if (-1 < iVar2) {
        iVar4 = iVar2;
      }
      puVar5[lVar1] = iVar4 >> 3;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
    uVar3 = uVar3 + 1;
    puVar5 = puVar5 + 0x10;
  } while (uVar3 != 0x31);
  return;
}

Assistant:

void OPNB::InitADPCMATable()
{
	const static int8 table2[] =
	{
		 1,  3,  5,  7,  9, 11, 13, 15,
		-1, -3, -5, -7, -9,-11,-13,-15,
	};

	for (int i=0; i<=48; i++)
	{
		int s = int(16.0 * pow (1.1, i) * 3);
		for (int j=0; j<16; j++)
		{
			jedi_table[i*16+j] = s * table2[j] / 8;
		}
	}
}